

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug_p.h
# Opt level: O2

void QtDebugUtils::formatQRect<QRect>(QDebug *debug,QRect *rect)

{
  QDebug *pQVar1;
  long lVar2;
  long lVar3;
  
  pQVar1 = QDebug::operator<<(debug,(rect->x1).m_i);
  pQVar1 = QDebug::operator<<(pQVar1,',');
  pQVar1 = QDebug::operator<<(pQVar1,(rect->y1).m_i);
  QDebug::operator<<(pQVar1,' ');
  lVar3 = (long)(rect->x2).m_i - (long)(rect->x1).m_i;
  lVar2 = (long)(rect->y2).m_i - (long)(rect->y1).m_i;
  pQVar1 = QDebug::operator<<(debug,lVar3 + 1);
  pQVar1 = QDebug::operator<<(pQVar1,'x');
  QDebug::operator<<(pQVar1,lVar2 + 1);
  if (0x7ffffffe < lVar2 || 0x7ffffffe < lVar3) {
    QDebug::operator<<(debug," (oversized)");
    return;
  }
  return;
}

Assistant:

static inline void formatQRect(QDebug &debug, const Rect &rect)
{
    debug << rect.x() << ',' << rect.y() << ' ';
    if constexpr (std::is_same_v<Rect, QRect>) {
        // QRect may overflow. Calculate width and height in higher precision.
        const qint64 w = qint64(rect.right()) - rect.left() + 1;
        const qint64 h = qint64(rect.bottom()) - rect.top() + 1;
        debug << w << 'x' << h;

        constexpr qint64 M = (std::numeric_limits<int>::max)();
        if (w > M || h > M)
            debug << " (oversized)";
    } else {
        debug << rect.width() << 'x' << rect.height();
    }
}